

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_vertical_shear_transform(ALLEGRO_TRANSFORM *trans,float theta)

{
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float s;
  
  fVar1 = tanf(in_XMM0_Da);
  in_RDI[1] = *in_RDI * fVar1 + in_RDI[1];
  in_RDI[5] = in_RDI[4] * fVar1 + in_RDI[5];
  in_RDI[0xd] = in_RDI[0xc] * fVar1 + in_RDI[0xd];
  return;
}

Assistant:

void al_vertical_shear_transform(ALLEGRO_TRANSFORM* trans, float theta)
{
   float s;
   ASSERT(trans);
   s = tanf(theta);

   trans->m[0][1] += trans->m[0][0] * s;
   trans->m[1][1] += trans->m[1][0] * s;
   trans->m[3][1] += trans->m[3][0] * s;
}